

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_fax3.c
# Opt level: O0

int Fax3Encode2DRow(TIFF *tif,uchar *bp,uchar *rp,uint32_t bits)

{
  byte bVar1;
  int iVar2;
  int local_84;
  int local_7c;
  int local_74;
  uint32_t local_6c;
  int local_68;
  int local_60;
  int local_5c;
  uint local_58;
  int local_54;
  uint32_t local_4c;
  uint32_t local_48;
  int32_t d;
  uint32_t b2;
  uint32_t a2;
  uint32_t b1;
  uint32_t a1;
  uint32_t a0;
  uint32_t bits_local;
  uchar *rp_local;
  uchar *bp_local;
  TIFF *tif_local;
  
  b1 = 0;
  if ((int)(uint)*bp >> 7 == 0) {
    local_48 = find0span(bp,0,bits);
  }
  else {
    local_48 = 0;
  }
  a2 = local_48;
  if ((int)(uint)*rp >> 7 == 0) {
    local_4c = find0span(rp,0,bits);
  }
  else {
    local_4c = 0;
  }
  b2 = local_4c;
  do {
    local_58 = bits;
    if (b2 < bits) {
      if (((int)(uint)rp[b2 >> 3] >> (7 - ((byte)b2 & 7) & 0x1f) & 1U) == 0) {
        local_54 = find0span(rp,b2,bits);
      }
      else {
        local_54 = find1span(rp,b2,bits);
      }
      local_58 = b2 + local_54;
    }
    if (local_58 < a2) {
      iVar2 = Fax3PutBits(tif,1,4);
      if (iVar2 == 0) {
        return 0;
      }
      b1 = local_58;
    }
    else {
      if ((b2 < a2) || (3 < b2 - a2)) {
        if ((b2 < a2) && (a2 - b2 < 4)) {
          local_60 = -(a2 - b2);
        }
        else {
          local_60 = 0x7fffffff;
        }
        local_5c = local_60;
      }
      else {
        local_5c = b2 - a2;
      }
      if ((local_5c < -3) || (3 < local_5c)) {
        local_6c = bits;
        if (a2 < bits) {
          if (((int)(uint)bp[a2 >> 3] >> (7 - ((byte)a2 & 7) & 0x1f) & 1U) == 0) {
            local_68 = find0span(bp,a2,bits);
          }
          else {
            local_68 = find1span(bp,a2,bits);
          }
          local_6c = a2 + local_68;
        }
        iVar2 = Fax3PutBits(tif,1,3);
        if (iVar2 == 0) {
          return 0;
        }
        if ((b1 + a2 == 0) || (((int)(uint)bp[b1 >> 3] >> (7 - ((byte)b1 & 7) & 0x1f) & 1U) == 0)) {
          iVar2 = putspan(tif,a2 - b1,TIFFFaxWhiteCodes);
          if (iVar2 == 0) {
            return 0;
          }
          iVar2 = putspan(tif,local_6c - a2,TIFFFaxBlackCodes);
          if (iVar2 == 0) {
            return 0;
          }
        }
        else {
          iVar2 = putspan(tif,a2 - b1,TIFFFaxBlackCodes);
          if (iVar2 == 0) {
            return 0;
          }
          iVar2 = putspan(tif,local_6c - a2,TIFFFaxWhiteCodes);
          if (iVar2 == 0) {
            return 0;
          }
        }
        b1 = local_6c;
      }
      else {
        iVar2 = Fax3PutBits(tif,(uint)vcodes[local_5c + 3].code,(uint)vcodes[local_5c + 3].length);
        if (iVar2 == 0) {
          return 0;
        }
        b1 = a2;
      }
    }
    if (bits <= b1) {
      return 1;
    }
    bVar1 = (byte)b1;
    if (((int)(uint)bp[b1 >> 3] >> (7 - (bVar1 & 7) & 0x1f) & 1U) == 0) {
      local_74 = find0span(bp,b1,bits);
    }
    else {
      local_74 = find1span(bp,b1,bits);
    }
    a2 = b1 + local_74;
    if (((int)(uint)bp[b1 >> 3] >> (7 - (bVar1 & 7) & 0x1f) & 1U) == 0) {
      local_7c = find1span(rp,b1,bits);
    }
    else {
      local_7c = find0span(rp,b1,bits);
    }
    iVar2 = b1 + local_7c;
    if (((int)(uint)bp[b1 >> 3] >> (7 - (bVar1 & 7) & 0x1f) & 1U) == 0) {
      local_84 = find0span(rp,iVar2,bits);
    }
    else {
      local_84 = find1span(rp,iVar2,bits);
    }
    b2 = iVar2 + local_84;
  } while( true );
}

Assistant:

static int Fax3Encode2DRow(TIFF *tif, unsigned char *bp, unsigned char *rp,
                           uint32_t bits)
{
#define PIXEL(buf, ix) ((((buf)[(ix) >> 3]) >> (7 - ((ix)&7))) & 1)
    uint32_t a0 = 0;
    uint32_t a1 = (PIXEL(bp, 0) != 0 ? 0 : finddiff(bp, 0, bits, 0));
    uint32_t b1 = (PIXEL(rp, 0) != 0 ? 0 : finddiff(rp, 0, bits, 0));
    uint32_t a2, b2;

    for (;;)
    {
        b2 = finddiff2(rp, b1, bits, PIXEL(rp, b1));
        if (b2 >= a1)
        {
            /* Naive computation triggers
             * -fsanitize=undefined,unsigned-integer-overflow */
            /* although it is correct unless the difference between both is < 31
             * bit */
            /* int32_t d = b1 - a1; */
            int32_t d = (b1 >= a1 && b1 - a1 <= 3U)  ? (int32_t)(b1 - a1)
                        : (b1 < a1 && a1 - b1 <= 3U) ? -(int32_t)(a1 - b1)
                                                     : 0x7FFFFFFF;
            if (!(-3 <= d && d <= 3))
            { /* horizontal mode */
                a2 = finddiff2(bp, a1, bits, PIXEL(bp, a1));
                if (!putcode(tif, &horizcode))
                    return 0;
                if (a0 + a1 == 0 || PIXEL(bp, a0) == 0)
                {
                    if (!putspan(tif, a1 - a0, TIFFFaxWhiteCodes))
                        return 0;
                    if (!putspan(tif, a2 - a1, TIFFFaxBlackCodes))
                        return 0;
                }
                else
                {
                    if (!putspan(tif, a1 - a0, TIFFFaxBlackCodes))
                        return 0;
                    if (!putspan(tif, a2 - a1, TIFFFaxWhiteCodes))
                        return 0;
                }
                a0 = a2;
            }
            else
            { /* vertical mode */
                if (!putcode(tif, &vcodes[d + 3]))
                    return 0;
                a0 = a1;
            }
        }
        else
        { /* pass mode */
            if (!putcode(tif, &passcode))
                return 0;
            a0 = b2;
        }
        if (a0 >= bits)
            break;
        a1 = finddiff(bp, a0, bits, PIXEL(bp, a0));
        b1 = finddiff(rp, a0, bits, !PIXEL(bp, a0));
        b1 = finddiff(rp, b1, bits, PIXEL(bp, a0));
    }
    return (1);
#undef PIXEL
}